

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

int __thiscall PClass::FindVirtualIndex(PClass *this,FName *name,PPrototype *proto)

{
  PType **ppPVar1;
  PType **ppPVar2;
  uint uVar3;
  uint uVar4;
  VMFunction *pVVar5;
  PPrototype *pPVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar8 = 0;
  do {
    if (uVar8 == (this->Virtuals).Count) {
      return -1;
    }
    pVVar5 = (this->Virtuals).Array[uVar8];
    if ((pVVar5->Name).Index == name->Index) {
      pPVar6 = pVVar5->Proto;
      uVar3 = (pPVar6->ReturnTypes).Count;
      if ((uVar3 == (proto->ReturnTypes).Count) &&
         (uVar4 = (pPVar6->ArgumentTypes).Count, uVar4 == (proto->ArgumentTypes).Count)) {
        uVar7 = 1;
LAB_003977d7:
        if (uVar7 < uVar4) break;
        uVar7 = 0;
        do {
          if (uVar3 == uVar7) {
            return (int)uVar8;
          }
          ppPVar1 = (proto->ReturnTypes).Array + uVar7;
          ppPVar2 = (pPVar6->ReturnTypes).Array + uVar7;
          uVar7 = uVar7 + 1;
        } while (*ppPVar1 == *ppPVar2);
      }
    }
LAB_00397823:
    uVar8 = uVar8 + 1;
  } while( true );
  ppPVar1 = (proto->ArgumentTypes).Array + uVar7;
  ppPVar2 = (pPVar6->ArgumentTypes).Array + uVar7;
  uVar7 = uVar7 + 1;
  if (*ppPVar1 != *ppPVar2) goto LAB_00397823;
  goto LAB_003977d7;
}

Assistant:

int PClass::FindVirtualIndex(FName name, PPrototype *proto)
{
	for (unsigned i = 0; i < Virtuals.Size(); i++)
	{
		if (Virtuals[i]->Name == name)
		{
			auto vproto = Virtuals[i]->Proto;
			if (vproto->ReturnTypes.Size() != proto->ReturnTypes.Size() ||
				vproto->ArgumentTypes.Size() != proto->ArgumentTypes.Size())
			{
				continue;	// number of parameters does not match, so it's incompatible
			}
			bool fail = false;
			// The first argument is self and will mismatch so just skip it.
			for (unsigned a = 1; a < proto->ArgumentTypes.Size(); a++)
			{
				if (proto->ArgumentTypes[a] != vproto->ArgumentTypes[a])
				{
					fail = true;
					break;
				}
			}
			if (fail) continue;

			for (unsigned a = 0; a < proto->ReturnTypes.Size(); a++)
			{
				if (proto->ReturnTypes[a] != vproto->ReturnTypes[a])
				{
					fail = true;
					break;
				}
			}
			if (!fail) return i;
		}
	}
	return -1;
}